

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

_Bool openjtalk_setVoicePathSjis(OpenJTalk *oj,char *path)

{
  _Bool _Var1;
  char *pcVar2;
  char temp [260];
  char acStack_118 [264];
  
  if (oj == (OpenJTalk *)0x0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else if (path == (char *)0x0) {
    oj->errorCode = OPENJTALKERROR_BUFFER_IS_NULL;
  }
  else {
    oj->errorCode = OPENJTALKERROR_NO_ERROR;
    if (*path != '\0') {
      pcVar2 = convert_charset_path(path,CS_SHIFT_JIS,acStack_118,CS_UTF_8);
      if (pcVar2 == (char *)0x0) {
        return false;
      }
      _Var1 = set_voice_path(oj,acStack_118);
      return _Var1;
    }
    oj->errorCode = OPENJTALKERROR_PATH_STRING_IS_NULL_OR_EMPTY;
  }
  return false;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_setVoicePathSjis(OpenJTalk *oj, const char *path)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return false;
	}

	if (!path)
	{
		oj->errorCode = OPENJTALKERROR_BUFFER_IS_NULL;
		return false;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	if (!path || strlen(path) == 0)
	{
		oj->errorCode = OPENJTALKERROR_PATH_STRING_IS_NULL_OR_EMPTY;
		return false;
	}

	char temp[MAX_PATH];
#if defined(_WIN32)
	char *res = sjistou8_path(path, temp);
#else
	char *res = sjistou8_path(path, temp);
#endif
	if (!res)
	{
		return false;
	}
	return set_voice_path(oj, temp);
}